

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool check_fileext(path *filepath,string *fileext)

{
  byte bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  string ext;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  path *in_stack_ffffffffffffff78;
  path *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_30 [48];
  
  __lhs = &local_58;
  std::filesystem::__cxx11::path::extension(in_stack_ffffffffffffff98);
  std::filesystem::__cxx11::path::string(in_stack_ffffffffffffff78);
  std::filesystem::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  __result._M_current = (char *)local_30;
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
            (in_RSI,in_stack_ffffffffffffff60,__result,
             (_func_int_int *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  bVar1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_RSI._M_current);
  std::__cxx11::string::~string(local_30);
  return (bool)(bVar1 & 1);
}

Assistant:

bool check_fileext(const filesystem::path &filepath, const std::string fileext) {
	std::string ext{filepath.extension().string()}; // extract file ext
	std::transform(ext.begin(), ext.end(), ext.begin(), ::tolower);                 // make ext lowercase
	return ext == fileext;
}